

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *
duckdb::Catalog::GetSchemas
          (vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> *__return_storage_ptr__,
          ClientContext *context,string *catalog_name)

{
  CatalogEntryRetriever retriever;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  ClientContext *local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  local_28 = context;
  GetSchemas(__return_storage_ptr__,(CatalogEntryRetriever *)&local_48,catalog_name);
  CatalogEntryRetriever::~CatalogEntryRetriever((CatalogEntryRetriever *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

vector<reference<SchemaCatalogEntry>> Catalog::GetSchemas(ClientContext &context, const string &catalog_name) {
	CatalogEntryRetriever retriever(context);
	return GetSchemas(retriever, catalog_name);
}